

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Const::set_value(Const *this,int64_t new_value)

{
  initializer_list<const_kratos::IRNode_*> __l;
  uint32_t width;
  ConstantLegal CVar1;
  bool *pbVar2;
  VarException *this_00;
  remove_reference_t<unsigned_int> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str;
  allocator<const_kratos::IRNode_*> local_111;
  Const *local_110;
  Const **local_108;
  size_type local_100;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_f8;
  undefined1 local_cc [36];
  int64_t local_a8;
  int64_t new_value_local;
  Const *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
  *vargs;
  char (*local_48) [42];
  char *local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
  *local_10;
  
  local_a8 = new_value;
  new_value_local = (int64_t)this;
  width = (*(this->super_Var).super_IRNode._vptr_IRNode[7])();
  pbVar2 = Var::is_signed(&this->super_Var);
  CVar1 = is_legal(new_value,width,(bool)(*pbVar2 & 1));
  if (CVar1 != Legal) {
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    local_cc._0_4_ = (*(this->super_Var).super_IRNode._vptr_IRNode[7])();
    local_38 = local_cc + 4;
    local_40 = "Unable to set const to {0} with width {1}";
    local_48 = (char (*) [42])&local_a8;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_int>
             *)local_cc;
    fmt::v7::make_args_checked<long&,unsigned_int,char[42],char>
              (&local_78,(v7 *)"Unable to set const to {0} with width {1}",local_48,
               (remove_reference_t<long_&> *)vargs,in_R8);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x23,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_90.values_;
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_88.size_;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)(local_cc + 4),(detail *)local_88.data_,format_str,args);
    local_108 = &local_110;
    local_100 = 1;
    local_110 = this;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_111);
    __l._M_len = local_100;
    __l._M_array = (iterator)local_108;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_f8,__l,&local_111);
    VarException::VarException(this_00,(string *)(local_cc + 4),&local_f8);
    __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
  }
  this->value_ = local_a8;
  return;
}

Assistant:

void Const::set_value(int64_t new_value) {
    if (Const::is_legal(new_value, width(), is_signed()) != Const::ConstantLegal::Legal) {
        throw VarException(
            ::format("Unable to set const to {0} with width {1}", new_value, width()), {this});
    }
    value_ = new_value;
}